

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O3

UnitsPtr __thiscall libcellml::Variable::units(Variable *this)

{
  size_type *psVar1;
  EntityImpl *pEVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  element_type *in_RDI;
  UnitsPtr UVar4;
  UnitsPtr UVar5;
  
  pEVar2 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
  _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                pEVar2[8].mId.field_2._M_allocated_capacity;
  (in_RDI->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity =
       (_func_int **)_Var3._M_pi;
  pEVar2 = *(EntityImpl **)((long)&pEVar2[8].mId.field_2 + 8);
  (in_RDI->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl = pEVar2;
  if (pEVar2 != (EntityImpl *)0x0) {
    _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      psVar1 = &(pEVar2->mId)._M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
      UVar4.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      UVar4.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (UnitsPtr)UVar4.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    psVar1 = &(pEVar2->mId)._M_string_length;
    *(int *)psVar1 = (int)*psVar1 + 1;
    UNLOCK();
  }
  UVar5.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  UVar5.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (UnitsPtr)UVar5.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

UnitsPtr Variable::units() const
{
    return pFunc()->mUnits;
}